

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O1

int tbx_parse1(tbx_conf_t *conf,int len,char *line,tbx_intv_t *intv)

{
  __int32_t **pp_Var1;
  char cVar2;
  short sVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  __int32_t **__nptr;
  int iVar10;
  char *t;
  __int32_t **local_60;
  tbx_conf_t *local_58;
  ulong local_50;
  __int32_t **local_48;
  tbx_intv_t *local_40;
  char *local_38;
  
  intv->ss = (char *)0x0;
  intv->se = (char *)0x0;
  *(undefined4 *)&intv->beg = 0xffffffff;
  *(undefined4 *)((long)&intv->beg + 4) = 0xffffffff;
  *(undefined4 *)&intv->end = 0xffffffff;
  *(undefined4 *)((long)&intv->end + 4) = 0xffffffff;
  if (-1 < len) {
    uVar8 = (ulong)(len + 1);
    iVar10 = 1;
    uVar9 = 0;
    iVar4 = 0;
    local_58 = conf;
    local_50 = uVar8;
    do {
      cVar2 = line[uVar9];
      if ((cVar2 == '\t') || (cVar2 == '\0')) {
        pp_Var1 = (__int32_t **)(line + uVar9);
        if (iVar10 == conf->sc) {
          intv->ss = line + iVar4;
          intv->se = (char *)pp_Var1;
        }
        else if (iVar10 == conf->bc) {
          lVar5 = strtol(line + iVar4,(char **)&local_60,0);
          intv->end = lVar5;
          intv->beg = lVar5;
          if (local_60 == (__int32_t **)(line + iVar4)) {
            return -1;
          }
          uVar6 = local_58->preset & 0x10000;
          *(ulong *)((long)&intv->beg + (ulong)(uVar6 >> 0xd)) = lVar5 + (-(ulong)(uVar6 == 0) | 1);
          if (intv->beg < 0) {
            intv->beg = 0;
          }
          uVar8 = local_50;
          conf = local_58;
          if (intv->end < 1) {
            intv->end = 1;
          }
        }
        else {
          sVar3 = (short)conf->preset;
          if (sVar3 == 2) {
            if (iVar10 == 8) {
              *(char *)pp_Var1 = '\0';
              local_48 = (__int32_t **)(line + iVar4);
              local_60 = (__int32_t **)strstr((char *)local_48,"END=");
              if (local_60 == local_48) {
                local_60 = (__int32_t **)((long)local_60 + 4);
              }
              else if ((local_60 != (__int32_t **)0x0) &&
                      (local_60 = (__int32_t **)strstr((char *)local_48,";END="),
                      local_60 != (__int32_t **)0x0)) {
                local_60 = (__int32_t **)((long)local_60 + 5);
              }
              if (local_60 != (__int32_t **)0x0) {
                lVar5 = strtol((char *)local_60,(char **)&local_60,0);
                intv->end = lVar5;
              }
              *(char *)pp_Var1 = cVar2;
              uVar8 = local_50;
              conf = local_58;
            }
            else if ((iVar10 == 4) && ((long)iVar4 < (long)uVar9)) {
              intv->end = (long)((int)uVar9 - iVar4) + intv->beg;
            }
          }
          else if (sVar3 == 1) {
            if (iVar10 == 6) {
              __nptr = (__int32_t **)(line + iVar4);
              iVar7 = 0;
              local_40 = intv;
              if ((long)iVar4 < (long)uVar9) {
                iVar7 = 0;
                local_48 = __ctype_toupper_loc();
                do {
                  lVar5 = strtol((char *)__nptr,&local_38,10);
                  if (((*local_48)[*local_38] - 0x44U < 0xb) &&
                     ((0x601U >> ((*local_48)[*local_38] - 0x44U & 0x1f) & 1) != 0)) {
                    iVar7 = iVar7 + (int)lVar5;
                  }
                  __nptr = (__int32_t **)(local_38 + 1);
                  conf = local_58;
                } while (__nptr < pp_Var1);
              }
              local_40->end = (long)(int)(iVar7 + (uint)(iVar7 == 0)) + local_40->beg;
              intv = local_40;
              uVar8 = local_50;
              local_60 = __nptr;
            }
          }
          else if ((sVar3 == 0) && (iVar10 == conf->ec)) {
            lVar5 = strtol(line + iVar4,(char **)&local_60,0);
            intv->end = lVar5;
            uVar8 = local_50;
            conf = local_58;
            if (local_60 == (__int32_t **)(line + iVar4)) {
              return -1;
            }
          }
        }
        iVar10 = iVar10 + 1;
        iVar4 = (int)uVar9 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
  }
  iVar4 = -1;
  if (((intv->ss != (char *)0x0) && (intv->se != (char *)0x0)) && (-1 < intv->beg)) {
    iVar4 = (int)(intv->end >> 0x3f);
  }
  return iVar4;
}

Assistant:

int tbx_parse1(const tbx_conf_t *conf, int len, char *line, tbx_intv_t *intv)
{
    int i, b = 0, id = 1, ncols = 0;
    char *s;
    intv->ss = intv->se = 0; intv->beg = intv->end = -1;
    for (i = 0; i <= len; ++i) {
        if (line[i] == '\t' || line[i] == 0) {
            ++ncols;
            if (id == conf->sc) {
                intv->ss = line + b; intv->se = line + i;
            } else if (id == conf->bc) {
                // here ->beg is 0-based.
                intv->beg = intv->end = strtol(line + b, &s, 0);
                if ( s==line+b ) return -1; // expected int
                if (!(conf->preset&TBX_UCSC)) --intv->beg;
                else ++intv->end;
                if (intv->beg < 0) intv->beg = 0;
                if (intv->end < 1) intv->end = 1;
            } else {
                if ((conf->preset&0xffff) == TBX_GENERIC) {
                    if (id == conf->ec)
                    {
                        intv->end = strtol(line + b, &s, 0);
                        if ( s==line+b ) return -1; // expected int
                    }
                } else if ((conf->preset&0xffff) == TBX_SAM) {
                    if (id == 6) { // CIGAR
                        int l = 0, op;
                        char *t;
                        for (s = line + b; s < line + i;) {
                            long x = strtol(s, &t, 10);
                            op = toupper(*t);
                            if (op == 'M' || op == 'D' || op == 'N') l += x;
                            s = t + 1;
                        }
                        if (l == 0) l = 1;
                        intv->end = intv->beg + l;
                    }
                } else if ((conf->preset&0xffff) == TBX_VCF) {
                    if (id == 4) {
                        if (b < i) intv->end = intv->beg + (i - b);
                    } else if (id == 8) { // look for "END="
                        int c = line[i];
                        line[i] = 0;
                        s = strstr(line + b, "END=");
                        if (s == line + b) s += 4;
                        else if (s) {
                            s = strstr(line + b, ";END=");
                            if (s) s += 5;
                        }
                        if (s) intv->end = strtol(s, &s, 0);
                        line[i] = c;
                    }
                }
            }
            b = i + 1;
            ++id;
        }
    }
    if (intv->ss == 0 || intv->se == 0 || intv->beg < 0 || intv->end < 0) return -1;
    return 0;
}